

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

void __thiscall
Am_Priority_List::Change_Second_Third_Priority
          (Am_Priority_List *this,Am_Object *obj,int second_priority,int third_priority)

{
  Am_Priority_List_Item *item_00;
  ostream *poVar1;
  Am_Object local_30;
  Am_Priority_List_Item *local_28;
  Am_Priority_List_Item *item;
  int third_priority_local;
  int second_priority_local;
  Am_Object *obj_local;
  Am_Priority_List *this_local;
  
  item._0_4_ = third_priority;
  item._4_4_ = second_priority;
  _third_priority_local = obj;
  obj_local = (Am_Object *)this;
  Am_Object::Am_Object(&local_30,obj);
  item_00 = take_out_obj(this,&local_30);
  Am_Object::~Am_Object(&local_30);
  local_28 = item_00;
  if (item_00 == (Am_Priority_List_Item *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar1 = std::operator<<(poVar1,"Change_Second_Third_Priority for ");
    poVar1 = ::operator<<(poVar1,obj);
    poVar1 = std::operator<<(poVar1," but not on list ");
    poVar1 = ::operator<<(poVar1,this);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  item_00->second_priority = item._4_4_;
  item_00->third_priority = (int)item;
  insert_item_at_right_place(this,item_00);
  return;
}

Assistant:

void
Am_Priority_List::Change_Second_Third_Priority(Am_Object obj,
                                               int second_priority,
                                               int third_priority)
{
  Am_Priority_List_Item *item = this->take_out_obj(obj);
  if (!item) {
    Am_ERRORO("Change_Second_Third_Priority for " << obj << " but not on list "
                                                  << *this,
              obj, 0);
  }
  item->second_priority = second_priority;
  item->third_priority = third_priority;
  this->insert_item_at_right_place(item);
}